

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O1

uint16_t mbedtls_ssl_read_version(uchar *version,int transport)

{
  ushort uVar1;
  uint16_t uVar2;
  ushort uVar3;
  
  uVar1 = *(ushort *)version;
  uVar3 = uVar1 << 8 | uVar1 >> 8;
  uVar2 = (uVar1 == 0xfffe | 0x200) - uVar3;
  if (transport != 1) {
    uVar2 = uVar3;
  }
  return uVar2;
}

Assistant:

uint16_t mbedtls_ssl_read_version(const unsigned char version[2],
                                  int transport)
{
    uint16_t tls_version = MBEDTLS_GET_UINT16_BE(version, 0);
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM) {
        tls_version =
            ~(tls_version - (tls_version == 0xfeff ? 0x0202 : 0x0201));
    }
#else
    ((void) transport);
#endif
    return tls_version;
}